

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_> * __thiscall
anurbs::Model::of_type<anurbs::BrepTrim>
          (vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
           *__return_storage_ptr__,Model *this)

{
  __node_base_ptr p_Var1;
  bool bVar2;
  __node_base_ptr p_Var3;
  undefined1 local_88 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_48;
  __node_base_ptr local_28;
  size_t i;
  Model *local_18;
  Model *this_local;
  vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_> *list;
  
  i._7_1_ = 0;
  local_18 = this;
  this_local = (Model *)__return_storage_ptr__;
  std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>::
  vector(__return_storage_ptr__);
  for (local_28 = (__node_base_ptr)0x0; p_Var1 = local_28,
      p_Var3 = (__node_base_ptr)nb_entries(this), p_Var1 < p_Var3;
      local_28 = (__node_base_ptr)((long)&local_28->_M_nxt + 1)) {
    get_type_abi_cxx11_(&local_48,this,(size_t)local_28);
    BrepTrim::type_name_abi_cxx11_();
    bVar2 = std::operator!=(&local_48,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_88 + 0x10));
    std::__cxx11::string::~string((string *)(local_88 + 0x10));
    std::__cxx11::string::~string((string *)&local_48);
    if (!bVar2) {
      get<anurbs::BrepTrim>((Model *)local_88,(size_t)this);
      std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>::
      push_back(__return_storage_ptr__,(value_type *)local_88);
      Ref<anurbs::BrepTrim>::~Ref((Ref<anurbs::BrepTrim> *)local_88);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Ref<TData>> of_type() const
    {
        std::vector<Ref<TData>> list;

        for (size_t i = 0; i < nb_entries(); i++) {
            if (get_type(i) != TData::type_name()) {
                continue;
            }
            list.push_back(get<TData>(i));
        }

        return list;
    }